

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Code parse(TokenList *list)

{
  undefined8 *puVar1;
  Compiler *c;
  Statement *__ptr;
  uint uVar2;
  size_t __size;
  bool bVar3;
  Code CVar4;
  Statement local_68;
  
  head = list;
  c = (Compiler *)malloc(0x10);
  c->parent = (Compiler *)0x0;
  c->indentLevel = 0;
  c->blockName = BLOCK_NONE;
  uVar2 = 0;
  __size = 0x40;
  __ptr = (Statement *)0x0;
  do {
    if (head == (TokenList *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = (head->value).type == TOKEN_EOF;
    }
    if (bVar3) {
      if (head->next != (TokenList *)0x0) {
        head = head->next;
      }
      if (bVar3) {
        free(c);
        CVar4._4_4_ = 0;
        CVar4.count = uVar2;
        CVar4.parts = __ptr;
        return CVar4;
      }
    }
    __ptr = (Statement *)realloc(__ptr,__size);
    part(&local_68,c);
    puVar1 = (undefined8 *)((long)__ptr + (__size - 0x10));
    *puVar1 = local_68.field_1.ifStatement.elseBranch.statements;
    puVar1[1] = local_68.field_1.routine.code.statements;
    puVar1 = (undefined8 *)((long)__ptr + (__size - 0x20));
    *puVar1 = local_68.field_1.ifStatement.thenBranch.statements;
    puVar1[1] = local_68.field_1._32_8_;
    puVar1 = (undefined8 *)((long)__ptr + (__size - 0x30));
    *puVar1 = local_68.field_1.blockStatement.statements;
    puVar1[1] = local_68.field_1.breakStatement.pos.file;
    puVar1 = (undefined8 *)((long)&__ptr[-1].type + __size);
    *puVar1 = local_68._0_8_;
    puVar1[1] = local_68.field_1._0_8_;
    uVar2 = uVar2 + 1;
    __size = __size + 0x40;
  } while( true );
}

Assistant:

Code parse(TokenList *list){
    Code c = {0, NULL};
    head = list;
    Compiler *comp = initCompiler(NULL, 0, BLOCK_NONE);
    while(!match(TOKEN_EOF)){
        c.count++;
        c.parts = (Statement *)reallocate(c.parts, sizeof(Statement) * c.count);
        c.parts[c.count - 1] = part(comp);
    }
    memfree(comp);
    return c;
}